

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool __thiscall httplib::ClientImpl::send_(ClientImpl *this,Request *req,Response *res,Error *error)

{
  mutex *__mutex;
  Headers *this_00;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__v;
  _Rb_tree_header *p_Var1;
  ulong uVar2;
  Headers *pHVar3;
  char cVar4;
  Error *pEVar5;
  bool bVar6;
  int iVar7;
  pthread_t pVar8;
  pthread_t pVar9;
  iterator iVar10;
  _Base_ptr p_Var11;
  Socket *pSVar12;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar13;
  bool ret;
  bool close_connection;
  char local_aa;
  byte local_a9;
  Socket *local_a8;
  Request *local_a0;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  undefined1 local_78;
  Response *local_68;
  Error *local_60;
  undefined8 *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  
  __mutex = &this->socket_mutex_;
  local_a0 = req;
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar7 != 0) {
    std::__throw_system_error(iVar7);
    goto LAB_00142099;
  }
  this->socket_should_be_closed_when_request_is_done_ = false;
  pSVar12 = &this->socket_;
  iVar7 = (this->socket_).sock;
  local_a8 = pSVar12;
  if (iVar7 == -1) {
LAB_00141eab:
    iVar7 = (*this->_vptr_ClientImpl[3])(this,pSVar12,error);
    if ((char)iVar7 == '\0') {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return false;
    }
  }
  else {
    bVar6 = detail::is_socket_alive(iVar7);
    if (!bVar6) {
      (*this->_vptr_ClientImpl[4])(this,pSVar12,0);
      if (pSVar12->sock != -1) {
        shutdown(pSVar12->sock,2);
      }
      if ((this->socket_requests_in_flight_ != 0) &&
         (pVar9 = (this->socket_requests_are_from_thread_)._M_thread, pVar8 = pthread_self(),
         pSVar12 = local_a8, pVar9 != pVar8)) {
        __assert_fail("socket_requests_in_flight_ == 0 || socket_requests_are_from_thread_ == std::this_thread::get_id()"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/httplib.h"
                      ,0x18c1,"void httplib::ClientImpl::close_socket(Socket &)");
      }
      if (pSVar12->sock != -1) {
        close(pSVar12->sock);
        pSVar12->sock = -1;
      }
      if (!bVar6) goto LAB_00141eab;
    }
  }
  uVar2 = this->socket_requests_in_flight_;
  local_68 = res;
  local_60 = error;
  if ((uVar2 < 2) ||
     (pVar9 = (this->socket_requests_are_from_thread_)._M_thread, pVar8 = pthread_self(),
     pVar9 == pVar8)) {
    this->socket_requests_in_flight_ = uVar2 + 1;
    pVar9 = pthread_self();
    (this->socket_requests_are_from_thread_)._M_thread = pVar9;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    p_Var11 = (this->default_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->default_headers_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var11 != p_Var1) {
      this_00 = &local_a0->headers;
      pHVar3 = &local_a0->headers;
      do {
        __v = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(p_Var11 + 1);
        iVar10 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find(&this_00->_M_t,(key_type *)__v);
        if ((_Rb_tree_header *)iVar10._M_node == &(pHVar3->_M_t)._M_impl.super__Rb_tree_header) {
          pVar13 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::_M_get_insert_equal_pos(&this_00->_M_t,(key_type *)__v);
          local_98._M_unused._0_8_ = (undefined8)this_00;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::
          _M_insert_<std::pair<std::__cxx11::string_const,std::__cxx11::string>const&,std::_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>::_Alloc_node>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)this_00,pVar13.first,pVar13.second,__v,(_Alloc_node *)&local_98);
        }
        p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
      } while ((_Rb_tree_header *)p_Var11 != p_Var1);
    }
    local_aa = '\0';
    local_a9 = this->keep_alive_ ^ 1;
    local_98._M_unused._M_object = operator_new(0x18);
    *(ClientImpl **)local_98._M_unused._0_8_ = this;
    *(byte **)((long)local_98._M_unused._0_8_ + 8) = &local_a9;
    *(char **)((long)local_98._M_unused._0_8_ + 0x10) = &local_aa;
    local_80 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/httplib.h:6455:32)>
               ::_M_invoke;
    local_98._8_8_ = 0;
    local_88 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/httplib.h:6455:32)>
               ::_M_manager;
    local_78 = 1;
    local_48 = (code *)0x0;
    pcStack_40 = (code *)0x0;
    local_58 = (undefined8 *)0x0;
    uStack_50 = 0;
    local_58 = (undefined8 *)operator_new(0x28);
    pEVar5 = local_60;
    *local_58 = this;
    local_58[1] = local_a0;
    local_58[2] = local_68;
    local_58[3] = &local_a9;
    local_58[4] = local_60;
    pcStack_40 = std::
                 _Function_handler<bool_(httplib::Stream_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/httplib.h:6472:33)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<bool_(httplib::Stream_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/httplib.h:6472:33)>
               ::_M_manager;
    iVar7 = (*this->_vptr_ClientImpl[5])(this,local_a8);
    local_aa = (char)iVar7;
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,3);
    }
    cVar4 = local_aa;
    if ((local_aa == '\0') && (*pEVar5 == Success)) {
      *pEVar5 = Unknown;
    }
    detail::scope_exit::~scope_exit((scope_exit *)&local_98);
    return (bool)cVar4;
  }
LAB_00142099:
  __assert_fail("socket_requests_are_from_thread_ == std::this_thread::get_id()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/httplib.h"
                ,0x1928,"bool httplib::ClientImpl::send_(Request &, Response &, Error &)");
}

Assistant:

inline bool ClientImpl::send_(Request &req, Response &res, Error &error) {
  {
    std::lock_guard<std::mutex> guard(socket_mutex_);

    // Set this to false immediately - if it ever gets set to true by the end of
    // the request, we know another thread instructed us to close the socket.
    socket_should_be_closed_when_request_is_done_ = false;

    auto is_alive = false;
    if (socket_.is_open()) {
      is_alive = detail::is_socket_alive(socket_.sock);
      if (!is_alive) {
        // Attempt to avoid sigpipe by shutting down nongracefully if it seems
        // like the other side has already closed the connection Also, there
        // cannot be any requests in flight from other threads since we locked
        // request_mutex_, so safe to close everything immediately
        const bool shutdown_gracefully = false;
        shutdown_ssl(socket_, shutdown_gracefully);
        shutdown_socket(socket_);
        close_socket(socket_);
      }
    }

    if (!is_alive) {
      if (!create_and_connect_socket(socket_, error)) { return false; }

#ifdef CPPHTTPLIB_OPENSSL_SUPPORT
      // TODO: refactoring
      if (is_ssl()) {
        auto &scli = static_cast<SSLClient &>(*this);
        if (!proxy_host_.empty() && proxy_port_ != -1) {
          auto success = false;
          if (!scli.connect_with_proxy(socket_, res, success, error)) {
            return success;
          }
        }

        if (!scli.initialize_ssl(socket_, error)) { return false; }
      }
#endif
    }

    // Mark the current socket as being in use so that it cannot be closed by
    // anyone else while this request is ongoing, even though we will be
    // releasing the mutex.
    if (socket_requests_in_flight_ > 1) {
      assert(socket_requests_are_from_thread_ == std::this_thread::get_id());
    }
    socket_requests_in_flight_ += 1;
    socket_requests_are_from_thread_ = std::this_thread::get_id();
  }

  for (const auto &header : default_headers_) {
    if (req.headers.find(header.first) == req.headers.end()) {
      req.headers.insert(header);
    }
  }

  auto ret = false;
  auto close_connection = !keep_alive_;

  auto se = detail::scope_exit([&]() {
    // Briefly lock mutex in order to mark that a request is no longer ongoing
    std::lock_guard<std::mutex> guard(socket_mutex_);
    socket_requests_in_flight_ -= 1;
    if (socket_requests_in_flight_ <= 0) {
      assert(socket_requests_in_flight_ == 0);
      socket_requests_are_from_thread_ = std::thread::id();
    }

    if (socket_should_be_closed_when_request_is_done_ || close_connection ||
        !ret) {
      shutdown_ssl(socket_, true);
      shutdown_socket(socket_);
      close_socket(socket_);
    }
  });

  ret = process_socket(socket_, [&](Stream &strm) {
    return handle_request(strm, req, res, close_connection, error);
  });

  if (!ret) {
    if (error == Error::Success) { error = Error::Unknown; }
  }

  return ret;
}